

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

bool __thiscall mapbox::detail::Earcut<unsigned_int>::isEar(Earcut<unsigned_int> *this,Node *ear)

{
  Node *p_00;
  Node *r;
  bool bVar1;
  double dVar2;
  Node *local_40;
  Node *p;
  Node *c;
  Node *b;
  Node *a;
  Node *ear_local;
  Earcut<unsigned_int> *this_local;
  
  p_00 = ear->prev;
  r = ear->next;
  dVar2 = area(this,p_00,ear,r);
  if (dVar2 < 0.0) {
    for (local_40 = ear->next->next; local_40 != ear->prev; local_40 = local_40->next) {
      bVar1 = pointInTriangle(this,p_00->x,p_00->y,ear->x,ear->y,r->x,r->y,local_40->x,local_40->y);
      if ((bVar1) && (dVar2 = area(this,local_40->prev,local_40,local_40->next), 0.0 <= dVar2)) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Earcut<N>::isEar(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // now make sure we don't have other points inside the potential ear
    Node* p = ear->next->next;

    while (p != ear->prev) {
        if (pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->next;
    }

    return true;
}